

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall
ON_NurbsSurface::ConvertSpanToBezier
          (ON_NurbsSurface *this,int span_index0,int span_index1,ON_BezierSurface *bezier_surface)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  uint uVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  ON_NurbsSurface bispan;
  
  if ((this->m_cv != (double *)0x0) && (pdVar5 = this->m_knot[0], pdVar5 != (double *)0x0)) {
    pdVar3 = this->m_knot[1];
    if (-1 < span_index0 && pdVar3 != (double *)0x0) {
      if (span_index1 < 0) {
        return false;
      }
      if (this->m_cv_count[0] - this->m_order[0] < span_index0) {
        return false;
      }
      if (((span_index1 <= this->m_cv_count[1] - this->m_order[1]) &&
          (lVar6 = (long)(this->m_order[0] + span_index0), pdVar5[lVar6 + -2] < pdVar5[lVar6 + -1]))
         && (lVar6 = (long)(this->m_order[1] + span_index1), pdVar3[lVar6 + -2] < pdVar3[lVar6 + -1]
            )) {
        ON_NurbsSurface(&bispan);
        bispan.m_cv = bezier_surface->m_cv;
        bispan.m_cv_capacity = bezier_surface->m_cv_capacity;
        Create(&bispan,this->m_dim,this->m_is_rat != 0,this->m_order[0],this->m_order[1],
               this->m_order[0],this->m_order[1]);
        iVar2 = this->m_dim;
        iVar1 = this->m_is_rat;
        for (iVar8 = 0; iVar7 = this->m_order[0], iVar8 < iVar7; iVar8 = iVar8 + 1) {
          for (iVar7 = 0; iVar7 < this->m_order[1]; iVar7 = iVar7 + 1) {
            uVar4 = bispan.m_cv_stride[1] * iVar7 + bispan.m_cv_stride[0] * iVar8;
            pdVar5 = bispan.m_cv + uVar4;
            if ((int)uVar4 < 0) {
              pdVar5 = (double *)0x0;
            }
            if (bispan.m_cv == (double *)0x0) {
              pdVar5 = (double *)0x0;
            }
            pdVar3 = CV(this,iVar8 + span_index0,span_index1 + iVar7);
            memcpy(pdVar5,pdVar3,(long)(int)(((iVar2 + 1) - (uint)(iVar1 == 0)) * 8));
          }
        }
        pdVar5 = this->m_knot[0];
        pdVar3 = this->m_knot[1];
        lVar6 = (long)(span_index1 + this->m_order[1]);
        if ((pdVar3[(uint)span_index1] != pdVar3[lVar6 + -2]) ||
           (NAN(pdVar3[(uint)span_index1]) || NAN(pdVar3[lVar6 + -2]))) {
          bVar9 = true;
        }
        else {
          bVar9 = pdVar5[(long)(iVar7 + span_index0) + -2] != pdVar5[(uint)span_index0] ||
                  pdVar5[(long)(iVar7 + span_index0) + -1] !=
                  pdVar5[(long)(span_index0 + iVar7 * 2) + -3];
        }
        if (((pdVar3[lVar6 + -1] != pdVar3[(long)(span_index1 + this->m_order[1] * 2) + -3]) ||
            (NAN(pdVar3[lVar6 + -1]) || NAN(pdVar3[(long)(span_index1 + this->m_order[1] * 2) + -3])
            )) || (bVar9)) {
          iVar2 = ON_KnotCount(bispan.m_order[0],bispan.m_cv_count[0]);
          memcpy(bispan.m_knot[0],pdVar5 + (uint)span_index0,(long)iVar2 << 3);
          pdVar5 = this->m_knot[1];
          iVar2 = ON_KnotCount(bispan.m_order[1],bispan.m_cv_count[1]);
          memcpy(bispan.m_knot[1],pdVar5 + (uint)span_index1,(long)iVar2 << 3);
          ClampEnd(&bispan,1,2);
          ClampEnd(&bispan,0,2);
        }
        bezier_surface->m_dim = bispan.m_dim;
        bezier_surface->m_is_rat = bispan.m_is_rat;
        *(ulong *)bezier_surface->m_order = CONCAT44(bispan.m_order[1],bispan.m_order[0]);
        *(ulong *)bezier_surface->m_cv_stride =
             CONCAT44(bispan.m_cv_stride[1],bispan.m_cv_stride[0]);
        bezier_surface->m_cv = bispan.m_cv;
        bezier_surface->m_cv_capacity = bispan.m_cv_capacity;
        bispan.m_cv = (double *)0x0;
        bispan.m_cv_capacity = 0;
        ~ON_NurbsSurface(&bispan);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::ConvertSpanToBezier(
    int span_index0,
    int span_index1, 
    ON_BezierSurface& bezier_surface
    ) const
{
  int i, j;
  if ( !m_cv || !m_knot[0] || !m_knot[1] )
    return false;
  if ( span_index0 < 0 ||  span_index0 > m_cv_count[0]-m_order[0] )
    return false;
  if ( span_index1 < 0 ||  span_index1 > m_cv_count[1]-m_order[1] )
    return false;
  i = span_index0+m_order[0]-2;
  if ( m_knot[0][i] >= m_knot[0][i+1] )
    return false;
  j = span_index1+m_order[1]-2;
  if ( m_knot[1][j] >= m_knot[1][j+1] )
    return false;
  {
    ON_NurbsSurface bispan;
    bispan.m_cv = bezier_surface.m_cv;
    bispan.m_cv_capacity = bezier_surface.m_cv_capacity;
    bispan.Create( m_dim, m_is_rat, m_order[0], m_order[1], m_order[0], m_order[1] );
    const int sizeof_cv = CVSize()*sizeof(*bispan.m_cv);
    for ( i = 0; i < m_order[0]; i++ ) for ( j = 0; j < m_order[1]; j++ )
    {
      memcpy( bispan.CV(i,j), CV(span_index0+i,span_index1+j), sizeof_cv ); 
    }
    i = span_index0+m_order[0]-2;
    j = span_index1+m_order[1]-2;
    bool bClamp = false;
    if ( m_knot[0][span_index0] != m_knot[0][span_index0+m_order[0]-2] )
      bClamp = true;
    if ( m_knot[0][span_index0+m_order[0]-1] != m_knot[0][span_index0+2*m_order[0]-3] )
      bClamp = true;
    if ( m_knot[1][span_index1] != m_knot[1][span_index1+m_order[1]-2] )
      bClamp = true;
    if ( m_knot[1][span_index1+m_order[1]-1] != m_knot[1][span_index1+2*m_order[1]-3] )
      bClamp = true;
    if ( bClamp )
    {
      memcpy( bispan.m_knot[0], m_knot[0]+span_index0, bispan.KnotCount(0)*sizeof(bispan.m_knot[0][0]) );
      memcpy( bispan.m_knot[1], m_knot[1]+span_index1, bispan.KnotCount(1)*sizeof(bispan.m_knot[1][0]) );
      bispan.ClampEnd(1,2);
      bispan.ClampEnd(0,2);
    }
    bezier_surface.m_dim = bispan.m_dim;
    bezier_surface.m_is_rat = bispan.m_is_rat;
    bezier_surface.m_order[0] = bispan.m_order[0];
    bezier_surface.m_order[1] = bispan.m_order[1];
    bezier_surface.m_cv_stride[0] = bispan.m_cv_stride[0];
    bezier_surface.m_cv_stride[1] = bispan.m_cv_stride[1];
    bezier_surface.m_cv = bispan.m_cv;
    bezier_surface.m_cv_capacity = bispan.m_cv_capacity;
    bispan.m_cv = 0;
    bispan.m_cv_capacity = 0;
  }
  return true;
}